

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O0

bool jaegertracing::utils::yaml::findOrDefault<bool,char[9],bool>
               (Node *node,char (*key) [9],bool *defaultValue)

{
  bool bVar1;
  undefined1 local_48 [8];
  Node valueNode;
  bool *defaultValue_local;
  char (*key_local) [9];
  Node *node_local;
  
  valueNode.m_pNode = (node *)defaultValue;
  YAML::Node::operator[]<char[9]>((Node *)local_48,node,key);
  bVar1 = YAML::Node::IsDefined((Node *)local_48);
  if (bVar1) {
    node_local._7_1_ = YAML::Node::as<bool>((Node *)local_48);
  }
  else {
    node_local._7_1_ = (bool)((byte)*valueNode.m_pNode & 1);
  }
  YAML::Node::~Node((Node *)local_48);
  return node_local._7_1_;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}